

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_hex
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  ulong uVar3;
  anon_class_16_2_cb75083a_for_f_conflict1 f;
  buffer_appender<char> bVar4;
  ulong uVar5;
  int num_digits;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  string_view prefix;
  undefined4 uStack_c;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    uVar2 = this->prefix_size;
    cVar1 = specs->type;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar5 = (ulong)this->abs_value;
  uVar6 = *(ulong *)((long)&this->abs_value + 8);
  do {
    num_digits = num_digits + 1;
    bVar7 = 0xf < uVar5;
    bVar8 = uVar6 != 0;
    uVar3 = -uVar6;
    uVar5 = uVar6 << 0x3c | uVar5 >> 4;
    uVar6 = uVar6 >> 4;
  } while (bVar8 || uVar3 < bVar7);
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar4 = write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_hex()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)
                     (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                     container,num_digits,prefix,specs,f);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }